

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

void Fra_ClassesTest(Fra_Cla_t *p,int Id1,int Id2)

{
  Aig_Obj_t **Entry;
  Aig_Obj_t *pAVar1;
  
  Entry = (Aig_Obj_t **)malloc(0x20);
  p->pMemClasses = Entry;
  if (Id1 < Id2) {
    pAVar1 = Aig_ManObj(p->pAig,Id1);
    *Entry = pAVar1;
    pAVar1 = Aig_ManObj(p->pAig,Id2);
    Entry[1] = pAVar1;
    Entry[2] = (Aig_Obj_t *)0x0;
    Entry[3] = (Aig_Obj_t *)0x0;
    *(Aig_Obj_t **)
     (*(long *)(*(long *)((long)(pAVar1->field_5).pData + 0x30) + 8) + (long)pAVar1->Id * 8) =
         *Entry;
    Vec_PtrPush(p->vClasses,Entry);
    return;
  }
  __assert_fail("Id1 < Id2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClass.c"
                ,0x253,"void Fra_ClassesTest(Fra_Cla_t *, int, int)");
}

Assistant:

void Fra_ClassesTest( Fra_Cla_t * p, int Id1, int Id2 )
{
    Aig_Obj_t ** pClass;
    p->pMemClasses = ABC_ALLOC( Aig_Obj_t *, 4 );
    pClass = p->pMemClasses;
    assert( Id1 < Id2 );
    pClass[0] = Aig_ManObj( p->pAig, Id1 );
    pClass[1] = Aig_ManObj( p->pAig, Id2 );
    pClass[2] = NULL;
    pClass[3] = NULL;
    Fra_ClassObjSetRepr( pClass[1], pClass[0] );
    Vec_PtrPush( p->vClasses, pClass );
}